

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

int kj::_::Debug::getOsErrorNumber(bool nonblocking)

{
  int *piVar1;
  int local_18;
  int local_14;
  int result;
  bool nonblocking_local;
  
  piVar1 = __errno_location();
  local_18 = *piVar1;
  if (local_18 == 4) {
    local_14 = -1;
  }
  else {
    if ((nonblocking) && ((local_18 == 0xb || (local_18 == 0xb)))) {
      local_18 = 0;
    }
    local_14 = local_18;
  }
  return local_14;
}

Assistant:

int Debug::getOsErrorNumber(bool nonblocking) {
  int result = errno;

  // On many systems, EAGAIN and EWOULDBLOCK have the same value, but this is not strictly required
  // by POSIX, so we need to check both.
  return result == EINTR ? -1
       : nonblocking && (result == EAGAIN || result == EWOULDBLOCK) ? 0
       : result;
}